

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O0

VkExtent3D vkt::sr::mipLevelExtents(VkExtent3D *baseExtents,deUint32 mipLevel)

{
  VkExtent3D VVar1;
  uint *puVar2;
  uint local_3c;
  uint local_38 [3];
  uint local_2c;
  uint local_28;
  deUint32 local_24;
  VkExtent3D *pVStack_20;
  deUint32 mipLevel_local;
  VkExtent3D *baseExtents_local;
  uint uStack_10;
  VkExtent3D result;
  
  local_24._0_1_ = (byte)mipLevel;
  local_28 = baseExtents->width >> ((byte)local_24 & 0x1f);
  local_2c = 1;
  local_24 = mipLevel;
  pVStack_20 = baseExtents;
  puVar2 = std::max<unsigned_int>(&local_28,&local_2c);
  baseExtents_local._4_4_ = *puVar2;
  local_38[2] = pVStack_20->height >> ((byte)local_24 & 0x1f);
  local_38[1] = 1;
  puVar2 = std::max<unsigned_int>(local_38 + 2,local_38 + 1);
  uStack_10 = *puVar2;
  local_38[0] = pVStack_20->depth >> ((byte)local_24 & 0x1f);
  local_3c = 1;
  puVar2 = std::max<unsigned_int>(local_38,&local_3c);
  VVar1.height = uStack_10;
  VVar1.width = baseExtents_local._4_4_;
  VVar1.depth = *puVar2;
  return VVar1;
}

Assistant:

VkExtent3D mipLevelExtents (const VkExtent3D& baseExtents, const deUint32 mipLevel)
{
	VkExtent3D result;

	result.width	= std::max(baseExtents.width  >> mipLevel, 1u);
	result.height	= std::max(baseExtents.height >> mipLevel, 1u);
	result.depth	= std::max(baseExtents.depth  >> mipLevel, 1u);

	return result;
}